

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fOcclusionQueryTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles3::Functional::OcclusionQueryCase::iterate(OcclusionQueryCase *this)

{
  TextureFormat TVar1;
  RenderContext *context;
  pointer pOVar2;
  pointer pOVar3;
  GLuint *ids;
  deRandom *pdVar4;
  undefined4 uVar5;
  GLint location;
  deUint32 dVar6;
  deUint32 dVar7;
  deUint32 dVar8;
  deUint32 dVar9;
  GLenum GVar10;
  RenderTarget *pRVar11;
  TestError *this_00;
  uint *rnd;
  Random *pRVar12;
  Surface *surface;
  void *__buf;
  uint uVar13;
  int iVar14;
  IterateResult IVar15;
  uint uVar16;
  int iVar17;
  char *pcVar18;
  ulong uVar19;
  bool bVar20;
  uint uVar21;
  int iVar22;
  uint uVar23;
  int iVar24;
  int width;
  ostringstream *poVar25;
  char *pcVar26;
  float minZ;
  float in_XMM4_Da;
  Surface pixels;
  vector<float,_std::allocator<float>_> targetVertices;
  vector<float,_std::allocator<float>_> occluderVertices;
  deUint32 resultAvailable;
  int local_2dc;
  vector<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
  local_2c8;
  GLuint *local_2b0;
  deRandom *local_2a8;
  uint local_2a0;
  uint local_29c;
  uint local_298;
  uint local_294;
  ulong local_290;
  ulong local_288;
  Surface local_280;
  vector<float,_std::allocator<float>_> local_268;
  vector<float,_std::allocator<float>_> local_248;
  string local_230;
  RenderTarget *local_210;
  string local_208;
  undefined1 local_1e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  _Alloc_hider local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b8 [4];
  ios_base local_170 [264];
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  TVar1 = (TextureFormat)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  pRVar11 = Context::getRenderTarget((this->super_TestCase).m_context);
  location = glwGetUniformLocation((this->m_program->m_program).m_program,"u_color");
  local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_2b0 = (GLuint *)operator_new(4);
  *local_2b0 = 0;
  local_288 = (ulong)(uint)pRVar11->m_width;
  local_290 = (ulong)(uint)pRVar11->m_height;
  poVar25 = (ostringstream *)(local_1e8 + 8);
  local_210 = pRVar11;
  local_1e8._0_8_ = TVar1;
  std::__cxx11::ostringstream::ostringstream(poVar25);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,"Case iteration ",0xf);
  std::ostream::operator<<(poVar25,this->m_iterNdx + 1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25," / ",3);
  std::ostream::operator<<(poVar25,10);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar25);
  std::ios_base::~ios_base(local_170);
  poVar25 = (ostringstream *)(local_1e8 + 8);
  local_1e8._0_8_ = TVar1;
  std::__cxx11::ostringstream::ostringstream(poVar25);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,"Parameters:\n",0xc);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,"- ",2);
  std::ostream::operator<<(poVar25,this->m_numOccluderDraws);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25," occluder draws, ",0x11);
  std::ostream::operator<<(poVar25,this->m_numOccludersPerDraw);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar25," primitive writes per draw,\n",0x1c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,"- ",2);
  std::ostream::operator<<(poVar25,this->m_numTargetDraws);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25," target draws, ",0xf);
  std::ostream::operator<<(poVar25,this->m_numTargetsPerDraw);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25," targets per draw\n",0x12);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar25);
  std::ios_base::~ios_base(local_170);
  minZ = 1.0;
  glwClearColor(0.0,0.0,0.0,1.0);
  glwClearDepthf(1.0);
  glwClearStencil(0);
  glwClear(0x4500);
  glwUseProgram((this->m_program->m_program).m_program);
  glwEnableVertexAttribArray(0);
  local_2c8.
  super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
  ._M_impl.super__Vector_impl_data._M_start = (OccluderType *)0x0;
  local_2c8.
  super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
  ._M_impl.super__Vector_impl_data._M_finish = (OccluderType *)0x0;
  local_2c8.
  super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (OccluderType *)0x0;
  uVar13 = this->m_occluderTypes;
  if ((uVar13 & 2) != 0) {
    local_1e8._0_4_ = I;
    std::
    vector<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
    ::_M_realloc_insert<deqp::gles3::Functional::OccluderType>
              (&local_2c8,(iterator)0x0,(OccluderType *)local_1e8);
    uVar13 = this->m_occluderTypes;
  }
  if ((uVar13 & 4) != 0) {
    local_1e8._0_4_ = LA;
    if (local_2c8.
        super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_2c8.
        super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
      ::_M_realloc_insert<deqp::gles3::Functional::OccluderType>
                (&local_2c8,
                 (iterator)
                 local_2c8.
                 super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(OccluderType *)local_1e8);
      uVar13 = this->m_occluderTypes;
    }
    else {
      *local_2c8.
       super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
       ._M_impl.super__Vector_impl_data._M_finish = OCCLUDER_DEPTH_CLEAR;
      local_2c8.
      super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_2c8.
           super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  if ((uVar13 & 8) != 0) {
    local_1e8._0_4_ = RGBA;
    if (local_2c8.
        super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_2c8.
        super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
      ::_M_realloc_insert<deqp::gles3::Functional::OccluderType>
                (&local_2c8,
                 (iterator)
                 local_2c8.
                 super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(OccluderType *)local_1e8);
      uVar13 = this->m_occluderTypes;
    }
    else {
      *local_2c8.
       super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
       ._M_impl.super__Vector_impl_data._M_finish = OCCLUDER_STENCIL_WRITE;
      local_2c8.
      super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_2c8.
           super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  if ((uVar13 & 0x10) != 0) {
    local_1e8._0_4_ = sBGR;
    if (local_2c8.
        super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        local_2c8.
        super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
      ::_M_realloc_insert<deqp::gles3::Functional::OccluderType>
                (&local_2c8,
                 (iterator)
                 local_2c8.
                 super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
                 ._M_impl.super__Vector_impl_data._M_finish,(OccluderType *)local_1e8);
    }
    else {
      *local_2c8.
       super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
       ._M_impl.super__Vector_impl_data._M_finish = OCCLUDER_STENCIL_CLEAR;
      local_2c8.
      super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_2c8.
           super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
  }
  if (0 < this->m_numOccluderDraws) {
    local_2a8 = &(this->m_rnd).m_rnd;
    local_294 = (int)local_288 + 0x65;
    local_298 = (int)local_290 + 0x65;
    local_29c = (int)local_288 + 1;
    local_2a0 = (int)local_290 + 1;
    local_2dc = 0;
    do {
      pOVar3 = local_2c8.
               super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pOVar2 = local_2c8.
               super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
               ._M_impl.super__Vector_impl_data._M_start;
      poVar25 = (ostringstream *)(local_1e8 + 8);
      if (local_2c8.
          super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          local_2c8.
          super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
          ._M_impl.super__Vector_impl_data._M_finish) break;
      dVar6 = deRandom_getUint32(local_2a8);
      pdVar4 = local_2a8;
      rnd = &switchD_0117b23e::switchdataD_01bfe23c;
      switch(local_2c8.
             super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
             ._M_impl.super__Vector_impl_data._M_start
             [(int)((ulong)dVar6 % ((ulong)((long)pOVar3 - (long)pOVar2) >> 2 & 0xffffffff))] -
             OCCLUDER_DEPTH_WRITE >> 1 |
             (uint)((local_2c8.
                     super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
                     ._M_impl.super__Vector_impl_data._M_start
                     [(int)((ulong)dVar6 % ((ulong)((long)pOVar3 - (long)pOVar2) >> 2 & 0xffffffff))
                     ] - OCCLUDER_DEPTH_WRITE & 1) != 0) << 0x1f) {
      case 0:
        local_1e8._0_8_ = TVar1;
        std::__cxx11::ostringstream::ostringstream(poVar25);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,"Occluder draw ",0xe);
        std::ostream::operator<<(poVar25,local_2dc + 1);
        pdVar4 = local_2a8;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25," / ",3);
        std::ostream::operator<<(poVar25,this->m_numOccluderDraws);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25," : ",3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,"Depth write",0xb);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar25);
        std::ios_base::~ios_base(local_170);
        local_48._0_4_ = pdVar4->x;
        local_48._4_4_ = pdVar4->y;
        uStack_40._0_4_ = pdVar4->z;
        uStack_40._4_4_ = pdVar4->w;
        generateVertices(&local_248,this->m_occluderSize,0.0,this->m_numOccludersPerDraw,
                         (int)&local_48,(Random *)rnd,0.6,minZ,in_XMM4_Da);
        glwEnable(0xb71);
        minZ = 1.0;
        glwUniform4f(location,0.0,0.0,1.0,1.0);
        glwVertexAttribPointer
                  (0,4,0x1406,'\0',0,
                   local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start);
        glwDrawArrays(4,0,this->m_numOccludersPerDraw * 3);
        glwDisable(0xb71);
        break;
      case OCCLUDER_SCISSOR:
        dVar6 = deRandom_getUint32(local_2a8);
        uVar16 = dVar6 % local_294;
        dVar6 = deRandom_getUint32(pdVar4);
        uVar21 = dVar6 % local_298;
        dVar6 = deRandom_getUint32(pdVar4);
        uVar13 = dVar6 % local_29c;
        dVar6 = deRandom_getUint32(pdVar4);
        uVar23 = dVar6 % local_2a0;
        poVar25 = (ostringstream *)(local_1e8 + 8);
        local_1e8._0_8_ = TVar1;
        std::__cxx11::ostringstream::ostringstream(poVar25);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,"Occluder draw ",0xe);
        std::ostream::operator<<(poVar25,local_2dc + 1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25," / ",3);
        std::ostream::operator<<(poVar25,this->m_numOccluderDraws);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25," : ",3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,"Depth clear",0xb);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar25);
        std::ios_base::~ios_base(local_170);
        poVar25 = (ostringstream *)(local_1e8 + 8);
        local_1e8._0_8_ = TVar1;
        std::__cxx11::ostringstream::ostringstream(poVar25);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar25,"Depth-clearing box drawn at ",0x1c);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,"(",1);
        iVar17 = uVar16 - 100;
        std::ostream::operator<<(poVar25,iVar17);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,", ",2);
        iVar22 = uVar21 - 100;
        std::ostream::operator<<(poVar25,iVar22);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,")",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,", width = ",10);
        iVar14 = uVar13 + 100;
        std::ostream::operator<<(poVar25,iVar14);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,", height = ",0xb);
        iVar24 = uVar23 + 100;
        std::ostream::operator<<(poVar25,iVar24);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,".",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar25);
        std::ios_base::~ios_base(local_170);
        glwEnable(0xc11);
        glwScissor(iVar17,iVar22,iVar14,iVar24);
        glwClearDepthf(0.0);
        minZ = 1.0;
        glwClearColor(0.0,0.5,0.8,1.0);
        glwClear(0x4100);
        glwDisable(0xc11);
        break;
      default:
        break;
      case OCCLUDER_DEPTH_WRITE|OCCLUDER_SCISSOR:
        poVar25 = (ostringstream *)(local_1e8 + 8);
        local_1e8._0_8_ = TVar1;
        std::__cxx11::ostringstream::ostringstream(poVar25);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,"Occluder draw ",0xe);
        std::ostream::operator<<(poVar25,local_2dc + 1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25," / ",3);
        std::ostream::operator<<(poVar25,this->m_numOccluderDraws);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25," : ",3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,"Stencil write",0xd);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar25);
        std::ios_base::~ios_base(local_170);
        local_58._0_4_ = local_2a8->x;
        local_58._4_4_ = local_2a8->y;
        uStack_50._0_4_ = local_2a8->z;
        uStack_50._4_4_ = local_2a8->w;
        generateVertices(&local_248,this->m_occluderSize,0.0,this->m_numOccludersPerDraw,
                         (int)&local_58,(Random *)rnd,0.6,minZ,in_XMM4_Da);
        glwStencilFunc(0x207,1,0xff);
        glwStencilOp(0x1e00,0x1e00,0x1e01);
        glwEnable(0xb90);
        minZ = 1.0;
        glwUniform4f(location,0.0,1.0,0.0,1.0);
        glwVertexAttribPointer
                  (0,4,0x1406,'\0',0,
                   local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start);
        glwDrawArrays(4,0,this->m_numOccludersPerDraw * 3);
        glwDisable(0xb90);
        break;
      case OCCLUDER_DEPTH_CLEAR|OCCLUDER_DEPTH_WRITE|OCCLUDER_SCISSOR:
        dVar6 = deRandom_getUint32(local_2a8);
        uVar16 = dVar6 % local_294;
        dVar6 = deRandom_getUint32(pdVar4);
        uVar21 = dVar6 % local_298;
        dVar6 = deRandom_getUint32(pdVar4);
        uVar13 = dVar6 % local_29c;
        dVar6 = deRandom_getUint32(pdVar4);
        uVar23 = dVar6 % local_2a0;
        poVar25 = (ostringstream *)(local_1e8 + 8);
        local_1e8._0_8_ = TVar1;
        std::__cxx11::ostringstream::ostringstream(poVar25);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,"Occluder draw ",0xe);
        std::ostream::operator<<(poVar25,local_2dc + 1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25," / ",3);
        std::ostream::operator<<(poVar25,this->m_numOccluderDraws);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25," : ",3);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,"Stencil clear",0xd);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar25);
        std::ios_base::~ios_base(local_170);
        poVar25 = (ostringstream *)(local_1e8 + 8);
        local_1e8._0_8_ = TVar1;
        std::__cxx11::ostringstream::ostringstream(poVar25);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar25,"Stencil-clearing box drawn at ",0x1e);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,"(",1);
        iVar17 = uVar16 - 100;
        std::ostream::operator<<(poVar25,iVar17);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,", ",2);
        iVar22 = uVar21 - 100;
        std::ostream::operator<<(poVar25,iVar22);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,")",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,", width = ",10);
        iVar14 = uVar13 + 100;
        std::ostream::operator<<(poVar25,iVar14);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,", height = ",0xb);
        iVar24 = uVar23 + 100;
        std::ostream::operator<<(poVar25,iVar24);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,".",1);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar25);
        std::ios_base::~ios_base(local_170);
        glwEnable(0xc11);
        glwScissor(iVar17,iVar22,iVar14,iVar24);
        glwClearStencil(1);
        minZ = 1.0;
        glwClearColor(0.0,0.8,0.5,1.0);
        glwClear(0x4400);
        glwDisable(0xc11);
      }
      local_2dc = local_2dc + 1;
    } while (local_2dc < this->m_numOccluderDraws);
  }
  if ((this->m_occluderTypes & 1) != 0) {
    pRVar12 = &this->m_rnd;
    dVar6 = deRandom_getUint32(&pRVar12->m_rnd);
    iVar14 = (int)local_288;
    dVar7 = deRandom_getUint32(&pRVar12->m_rnd);
    iVar17 = (int)local_290;
    dVar8 = deRandom_getUint32(&pRVar12->m_rnd);
    iVar22 = (int)local_288;
    dVar9 = deRandom_getUint32(&pRVar12->m_rnd);
    iVar24 = (int)local_290;
    poVar25 = (ostringstream *)(local_1e8 + 8);
    local_1e8._0_8_ = TVar1;
    std::__cxx11::ostringstream::ostringstream(poVar25);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar25,"Scissor box drawn at ",0x15);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,"(",1);
    iVar14 = dVar6 % (iVar14 + 1U) - 100;
    std::ostream::operator<<(poVar25,iVar14);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,", ",2);
    iVar17 = dVar7 % (iVar17 + 1U) - 100;
    std::ostream::operator<<(poVar25,iVar17);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,")",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,", width = ",10);
    width = dVar8 % (iVar22 - 0x95U) + 0xfa;
    std::ostream::operator<<(poVar25,width);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,", height = ",0xb);
    iVar22 = dVar9 % (iVar24 - 0x95U) + 0xfa;
    std::ostream::operator<<(poVar25,iVar22);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,".",1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar25);
    std::ios_base::~ios_base(local_170);
    glwEnable(0xc11);
    glwScissor(iVar14,iVar17,width,iVar22);
  }
  glwGenQueries(1,local_2b0);
  glwBeginQuery(this->m_queryMode,*local_2b0);
  GVar10 = glwGetError();
  pRVar12 = (Random *)0x154;
  glu::checkError(GVar10,"Occlusion query started",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fOcclusionQueryTests.cpp"
                  ,0x154);
  glwEnable(0xb71);
  glwEnable(0xb90);
  glwStencilFunc(0x202,0,0xff);
  if (0 < this->m_numTargetDraws) {
    iVar14 = 0;
    do {
      local_68._0_4_ = (this->m_rnd).m_rnd.x;
      local_68._4_4_ = (this->m_rnd).m_rnd.y;
      uStack_60._0_4_ = (this->m_rnd).m_rnd.z;
      uStack_60._4_4_ = (this->m_rnd).m_rnd.w;
      generateVertices(&local_268,this->m_targetSize,0.4,this->m_numTargetsPerDraw,(int)&local_68,
                       pRVar12,1.0,minZ,in_XMM4_Da);
      if (local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        minZ = 1.0;
        glwUniform4f(location,1.0,0.0,0.0,1.0);
        pRVar12 = (Random *)0x0;
        glwVertexAttribPointer
                  (0,4,0x1406,'\0',0,
                   local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_start);
        glwDrawArrays(4,0,this->m_numTargetsPerDraw * 3);
      }
      iVar14 = iVar14 + 1;
    } while (iVar14 < this->m_numTargetDraws);
  }
  glwEndQuery(this->m_queryMode);
  glwFinish();
  glwDisable(0xc11);
  glwDisable(0xb90);
  glwDisable(0xb71);
  local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffff00000000;
  glwGetQueryObjectuiv(*local_2b0,0x8867,(GLuint *)local_1e8);
  ids = local_2b0;
  if (local_1e8._0_4_ == 0) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Occlusion query failed to return a result after glFinish()",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fOcclusionQueryTests.cpp"
               ,0x174);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  local_1e8._0_8_ = local_1e8._0_8_ & 0xffffffff00000000;
  glwGetQueryObjectuiv(*local_2b0,0x8866,(GLuint *)local_1e8);
  uVar5 = local_1e8._0_4_;
  glwDeleteQueries(1,ids);
  GVar10 = glwGetError();
  glu::checkError(GVar10,"Occlusion query finished",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fOcclusionQueryTests.cpp"
                  ,0x17f);
  tcu::Surface::Surface(&local_280,local_210->m_width,local_210->m_height);
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  local_230._M_dataplus._M_p = (pointer)0x300000008;
  if ((void *)local_280.m_pixels.m_cap != (void *)0x0) {
    local_280.m_pixels.m_cap = (size_t)local_280.m_pixels.m_ptr;
  }
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1e8,(TextureFormat *)&local_230,local_280.m_width,
             local_280.m_height,1,(void *)local_280.m_pixels.m_cap);
  glu::readPixels(context,0,0,(PixelBufferAccess *)local_1e8);
  iVar14 = 0;
  bVar20 = false;
  if (0 < local_280.m_height) {
    iVar17 = 0;
    do {
      uVar19 = (ulong)(uint)local_280.m_width;
      iVar22 = iVar14;
      if (0 < local_280.m_width) {
        do {
          if (*(char *)((long)local_280.m_pixels.m_ptr + (long)iVar22 * 4) != '\0') {
            bVar20 = true;
            goto LAB_0117be54;
          }
          iVar22 = iVar22 + 1;
          uVar19 = uVar19 - 1;
        } while (uVar19 != 0);
      }
      iVar17 = iVar17 + 1;
      iVar14 = iVar14 + local_280.m_width;
    } while (iVar17 != local_280.m_height);
    bVar20 = false;
  }
LAB_0117be54:
  poVar25 = (ostringstream *)(local_1e8 + 8);
  local_1e8._0_8_ = TVar1;
  std::__cxx11::ostringstream::ostringstream(poVar25);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar25,"Occlusion query result:  Target ",0x20);
  pcVar26 = "invisible";
  pcVar18 = "invisible";
  if (uVar5 != 0) {
    pcVar18 = "visible";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar25,pcVar18,(ulong)(uVar5 == 0) * 2 + 7);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar25,"Framebuffer read result: Target ",0x20);
  if (bVar20 != false) {
    pcVar26 = "visible";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar25,pcVar26,(ulong)(bVar20 ^ 1U) * 2 + 7);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar25);
  std::ios_base::~ios_base(local_170);
  if (this->m_queryMode == 0x8d6a) {
    if (uVar5 != 0 || (bVar20 ^ 1U) != 0) {
LAB_0117c0d2:
      poVar25 = (ostringstream *)(local_1e8 + 8);
      local_1e8._0_8_ = TVar1;
      std::__cxx11::ostringstream::ostringstream(poVar25);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,"Case passed!",0xc);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar25);
      std::ios_base::~ios_base(local_170);
      iVar14 = this->m_iterNdx + 1;
      this->m_iterNdx = iVar14;
      IVar15 = (IterateResult)(iVar14 < 10);
      goto LAB_0117c147;
    }
  }
  else if ((uVar5 != 0) == bVar20) goto LAB_0117c0d2;
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"Result image","");
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_208,"Result image","");
  surface = &local_280;
  tcu::LogImage::LogImage
            ((LogImage *)local_1e8,&local_230,&local_208,surface,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)local_1e8,TVar1.order,__buf,(size_t)surface);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_p != local_1b8) {
    operator_delete(local_1c8._M_p,local_1b8[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._0_8_ != &local_1d8) {
    operator_delete((void *)local_1e8._0_8_,local_1d8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  poVar25 = (ostringstream *)(local_1e8 + 8);
  local_1e8._0_8_ = TVar1;
  std::__cxx11::ostringstream::ostringstream(poVar25);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar25,"Case FAILED!",0xc);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1e8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar25);
  std::ios_base::~ios_base(local_170);
  IVar15 = STOP;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
             "Fail");
LAB_0117c147:
  tcu::Surface::~Surface(&local_280);
  if (local_2c8.
      super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
      ._M_impl.super__Vector_impl_data._M_start != (OccluderType *)0x0) {
    operator_delete(local_2c8.
                    super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_2c8.
                          super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_2c8.
                          super__Vector_base<deqp::gles3::Functional::OccluderType,_std::allocator<deqp::gles3::Functional::OccluderType>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  operator_delete(local_2b0,4);
  if (local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_268.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_248.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return IVar15;
}

Assistant:

OcclusionQueryCase::IterateResult OcclusionQueryCase::iterate (void)
{
	tcu::TestLog&				log					= m_testCtx.getLog();
	const tcu::RenderTarget&	renderTarget		= m_context.getRenderTarget();
	deUint32					colorUnif			= glGetUniformLocation(m_program->getProgram(), "u_color");

	std::vector<float>			occluderVertices;
	std::vector<float>			targetVertices;
	std::vector<deUint32>		queryIds(1, 0);
	bool						queryResult			= false;
	bool						colorReadResult		= false;
	int							targetW				= renderTarget.getWidth();
	int							targetH				= renderTarget.getHeight();

	log << tcu::TestLog::Message << "Case iteration " << m_iterNdx+1 << " / " << NUM_CASE_ITERATIONS << tcu::TestLog::EndMessage;
	log << tcu::TestLog::Message << "Parameters:\n"
								 << "- " << m_numOccluderDraws	<< " occluder draws, "	<< m_numOccludersPerDraw	<< " primitive writes per draw,\n"
								 << "- " << m_numTargetDraws	<< " target draws, "	<< m_numTargetsPerDraw		<< " targets per draw\n"
		<< tcu::TestLog::EndMessage;

	DE_ASSERT(m_program);

	glClearColor				(0.0f, 0.0f, 0.0f, 1.0f);
	glClearDepthf				(1.0f);
	glClearStencil				(0);
	glClear						(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
	glUseProgram				(m_program->getProgram());
	glEnableVertexAttribArray	(0);

	// Draw occluders

	std::vector<OccluderType> occOptions(0);
	if (m_occluderTypes & OCCLUDER_DEPTH_WRITE)		occOptions.push_back(OCCLUDER_DEPTH_WRITE);
	if (m_occluderTypes & OCCLUDER_DEPTH_CLEAR)		occOptions.push_back(OCCLUDER_DEPTH_CLEAR);
	if (m_occluderTypes & OCCLUDER_STENCIL_WRITE)	occOptions.push_back(OCCLUDER_STENCIL_WRITE);
	if (m_occluderTypes & OCCLUDER_STENCIL_CLEAR)	occOptions.push_back(OCCLUDER_STENCIL_CLEAR);

	for (int i = 0; i < m_numOccluderDraws; i++)
	{
		if (occOptions.empty())
			break;

		OccluderType type = occOptions[m_rnd.getInt(0, (int)occOptions.size()-1)];	// Choosing a random occluder type from available options

		switch (type)
		{
			case OCCLUDER_DEPTH_WRITE:
				log << tcu::TestLog::Message	<< "Occluder draw "	<< i+1 << " / " << m_numOccluderDraws << " : "
												<< "Depth write"	<< tcu::TestLog::EndMessage;

				generateVertices(occluderVertices, 2.0f, 2.0f, m_numOccludersPerDraw, 3, m_rnd, m_occluderSize, 0.0f, 0.6f);	// Generate vertices for occluding primitives

				DE_ASSERT(!occluderVertices.empty());

				glEnable				(GL_DEPTH_TEST);
				glUniform4f				(colorUnif, DEPTH_WRITE_COLOR.x(), DEPTH_WRITE_COLOR.y(), DEPTH_WRITE_COLOR.z(), DEPTH_WRITE_COLOR.w());
				glVertexAttribPointer	(0, ELEMENTS_PER_VERTEX, GL_FLOAT, GL_FALSE, 0, &occluderVertices[0]);
				glDrawArrays			(GL_TRIANGLES, 0, 3*m_numOccludersPerDraw);
				glDisable				(GL_DEPTH_TEST);

				break;

			case OCCLUDER_DEPTH_CLEAR:
			{
				int scissorBoxX = m_rnd.getInt(-DEPTH_CLEAR_OFFSET,	targetW);
				int scissorBoxY = m_rnd.getInt(-DEPTH_CLEAR_OFFSET,	targetH);
				int scissorBoxW = m_rnd.getInt( DEPTH_CLEAR_OFFSET,	targetW+DEPTH_CLEAR_OFFSET);
				int scissorBoxH = m_rnd.getInt( DEPTH_CLEAR_OFFSET,	targetH+DEPTH_CLEAR_OFFSET);

				log << tcu::TestLog::Message	<< "Occluder draw "	<< i+1 << " / " << m_numOccluderDraws << " : "	<< "Depth clear"
					<< tcu::TestLog::EndMessage;
				log << tcu::TestLog::Message	<< "Depth-clearing box drawn at "
												<< "("			<< scissorBoxX << ", "			<< scissorBoxY << ")"
												<< ", width = "	<< scissorBoxW << ", height = " << scissorBoxH << "."
					<< tcu::TestLog::EndMessage;

				glEnable		(GL_SCISSOR_TEST);
				glScissor		(scissorBoxX, scissorBoxY, scissorBoxW, scissorBoxH);
				glClearDepthf	(0.0f);
				glClearColor	(DEPTH_CLEAR_COLOR.x(), DEPTH_CLEAR_COLOR.y(), DEPTH_CLEAR_COLOR.z(), DEPTH_CLEAR_COLOR.w());
				glClear			(GL_COLOR_BUFFER_BIT | GL_DEPTH_BUFFER_BIT);
				glDisable		(GL_SCISSOR_TEST);

				break;
			}

			case OCCLUDER_STENCIL_WRITE:
				log << tcu::TestLog::Message	<< "Occluder draw "	<< i+1 << " / " << m_numOccluderDraws << " : "
												<< "Stencil write"	<< tcu::TestLog::EndMessage;

				generateVertices(occluderVertices, 2.0f, 2.0f, m_numOccludersPerDraw, 3, m_rnd, m_occluderSize, 0.0f, 0.6f);

				glStencilFunc	(GL_ALWAYS, 1, 0xFF);
				glStencilOp		(GL_KEEP, GL_KEEP, GL_REPLACE);

				DE_ASSERT(!occluderVertices.empty());

				glEnable				(GL_STENCIL_TEST);
				glUniform4f				(colorUnif, STENCIL_WRITE_COLOR.x(), STENCIL_WRITE_COLOR.y(), STENCIL_WRITE_COLOR.z(), STENCIL_WRITE_COLOR.w());
				glVertexAttribPointer	(0, ELEMENTS_PER_VERTEX, GL_FLOAT, GL_FALSE, 0, &occluderVertices[0]);
				glDrawArrays			(GL_TRIANGLES, 0, 3*m_numOccludersPerDraw);
				glDisable				(GL_STENCIL_TEST);

				break;

			case OCCLUDER_STENCIL_CLEAR:
			{
				int scissorBoxX = m_rnd.getInt(-STENCIL_CLEAR_OFFSET,	targetW);
				int scissorBoxY = m_rnd.getInt(-STENCIL_CLEAR_OFFSET,	targetH);
				int scissorBoxW = m_rnd.getInt(	STENCIL_CLEAR_OFFSET,	targetW+STENCIL_CLEAR_OFFSET);
				int scissorBoxH = m_rnd.getInt(	STENCIL_CLEAR_OFFSET,	targetH+STENCIL_CLEAR_OFFSET);

				log << tcu::TestLog::Message	<< "Occluder draw "	<< i+1 << " / " << m_numOccluderDraws << " : "	<< "Stencil clear"
					<< tcu::TestLog::EndMessage;
				log << tcu::TestLog::Message	<< "Stencil-clearing box drawn at "
												<< "("			<< scissorBoxX << ", "			<< scissorBoxY << ")"
												<< ", width = "	<< scissorBoxW << ", height = " << scissorBoxH << "."
					<< tcu::TestLog::EndMessage;

				glEnable		(GL_SCISSOR_TEST);
				glScissor		(scissorBoxX, scissorBoxY, scissorBoxW, scissorBoxH);
				glClearStencil	(1);
				glClearColor	(STENCIL_CLEAR_COLOR.x(), STENCIL_CLEAR_COLOR.y(), STENCIL_CLEAR_COLOR.z(), STENCIL_CLEAR_COLOR.w());
				glClear			(GL_COLOR_BUFFER_BIT | GL_STENCIL_BUFFER_BIT);
				glDisable		(GL_SCISSOR_TEST);

				break;
			}

			default:
				DE_ASSERT(false);
				break;
		}
	}

	if (m_occluderTypes & OCCLUDER_SCISSOR)
	{
		int scissorBoxX = m_rnd.getInt(-SCISSOR_OFFSET,	targetW-SCISSOR_OFFSET);
		int scissorBoxY = m_rnd.getInt(-SCISSOR_OFFSET,	targetH-SCISSOR_OFFSET);
		int scissorBoxW = m_rnd.getInt(SCISSOR_MINSIZE,	targetW+SCISSOR_OFFSET);
		int scissorBoxH = m_rnd.getInt(SCISSOR_MINSIZE,	targetH+SCISSOR_OFFSET);

		log << tcu::TestLog::Message	<< "Scissor box drawn at "
										<< "("			<< scissorBoxX << ", "			<< scissorBoxY << ")"
										<< ", width = "	<< scissorBoxW << ", height = " << scissorBoxH << "."
			<< tcu::TestLog::EndMessage;

		glEnable	(GL_SCISSOR_TEST);
		glScissor	(scissorBoxX, scissorBoxY, scissorBoxW, scissorBoxH);
	}

	glGenQueries	(1, &queryIds[0]);
	glBeginQuery	(m_queryMode, queryIds[0]);
	GLU_CHECK_MSG	("Occlusion query started");

	// Draw target primitives

	glEnable		(GL_DEPTH_TEST);
	glEnable		(GL_STENCIL_TEST);
	glStencilFunc	(GL_EQUAL, 0, 0xFF);

	for (int i = 0; i < m_numTargetDraws; i++)
	{
		generateVertices(targetVertices, 2.0f, 2.0f, m_numTargetsPerDraw, 3,  m_rnd, m_targetSize, 0.4f, 1.0f);		// Generate vertices for target primitives

		if (!targetVertices.empty())
		{
			glUniform4f				(colorUnif, TARGET_COLOR.x(), TARGET_COLOR.y(), TARGET_COLOR.z(), TARGET_COLOR.w());
			glVertexAttribPointer	(0, ELEMENTS_PER_VERTEX, GL_FLOAT, GL_FALSE, 0, &targetVertices[0]);
			glDrawArrays			(GL_TRIANGLES, 0, 3*m_numTargetsPerDraw);
		}
	}

	glEndQuery		(m_queryMode);
	glFinish		();
	glDisable		(GL_SCISSOR_TEST);
	glDisable		(GL_STENCIL_TEST);
	glDisable		(GL_DEPTH_TEST);

	// Check that query result is available.
	{
		deUint32 resultAvailable = GL_FALSE;
		glGetQueryObjectuiv(queryIds[0], GL_QUERY_RESULT_AVAILABLE, &resultAvailable);

		if (resultAvailable == GL_FALSE)
			TCU_FAIL("Occlusion query failed to return a result after glFinish()");
	}

	// Read query result.
	{
		deUint32 result = 0;
		glGetQueryObjectuiv(queryIds[0], GL_QUERY_RESULT, &result);
		queryResult = (result != GL_FALSE);
	}

	glDeleteQueries	(1, &queryIds[0]);
	GLU_CHECK_MSG	("Occlusion query finished");

	// Read pixel data

	tcu::Surface pixels(renderTarget.getWidth(), renderTarget.getHeight());
	glu::readPixels(m_context.getRenderContext(), 0, 0, pixels.getAccess());

	{
		int width = pixels.getWidth();
		int height = pixels.getHeight();

		for (int y = 0; y < height; y++)
		{
			for (int x = 0; x < width; x++)
			{
				if (pixels.getPixel(x,y).getRed() != 0)
				{
					colorReadResult = true;
					break;
				}
			}
			if (colorReadResult) break;
		}
	}

	log << tcu::TestLog::Message << "Occlusion query result:  Target " << (queryResult		? "visible" : "invisible") << "\n"
								 << "Framebuffer read result: Target " << (colorReadResult	? "visible" : "invisible") << tcu::TestLog::EndMessage;

	bool testOk = false;
	if (m_queryMode == GL_ANY_SAMPLES_PASSED_CONSERVATIVE)
	{
		if (queryResult || colorReadResult)
			testOk = queryResult;	// Allow conservative occlusion query to return false positives.
		else
			testOk = queryResult == colorReadResult;
	}
	else
		testOk = (queryResult == colorReadResult);

	if (!testOk)
	{
		log << tcu::TestLog::Image("Result image", "Result image", pixels);
		log << tcu::TestLog::Message << "Case FAILED!" << tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		return STOP;
	}

	log << tcu::TestLog::Message << "Case passed!" << tcu::TestLog::EndMessage;

	return (++m_iterNdx < NUM_CASE_ITERATIONS) ? CONTINUE : STOP;
}